

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_local(REF_NODE ref_node,REF_GLOB global,REF_INT *local)

{
  int local_2c;
  REF_STATUS ref_private_macro_code_raise;
  REF_INT location;
  REF_INT *local_local;
  REF_GLOB global_local;
  REF_NODE ref_node_local;
  
  *local = -1;
  _ref_private_macro_code_raise = local;
  local_local = (REF_INT *)global;
  global_local = (REF_GLOB)ref_node;
  ref_node_local._4_4_ = ref_sort_search_glob(ref_node->n,ref_node->sorted_global,global,&local_2c);
  if (ref_node_local._4_4_ == 0) {
    if (local_2c == -1) {
      ref_node_local._4_4_ = 5;
    }
    else {
      *_ref_private_macro_code_raise =
           *(REF_INT *)(*(long *)(global_local + 0x20) + (long)local_2c * 4);
      ref_node_local._4_4_ = 0;
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_local(REF_NODE ref_node, REF_GLOB global,
                                  REF_INT *local) {
  REF_INT location;

  (*local) = REF_EMPTY;

  RAISE(ref_sort_search_glob(ref_node_n(ref_node), ref_node->sorted_global,
                             global, &location));

  if ((location) == REF_EMPTY) return REF_NOT_FOUND;

  (*local) = ref_node->sorted_local[location];

  return REF_SUCCESS;
}